

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testYca.cpp
# Opt level: O0

void anon_unknown.dwarf_24287c::writeReadYca
               (char *fileName,Box2i *dw,RgbaChannels channels,LineOrder writeOrder,
               LineOrder readOrder,_func_void_Array2D<Imf_3_2::Rgba>_ptr_int_int *fillPixels)

{
  uint uVar1;
  int *piVar2;
  char *pcVar3;
  bool bVar4;
  undefined4 uVar5;
  int iVar6;
  ostream *poVar7;
  void *pvVar8;
  Rgba *pRVar9;
  int in_ECX;
  uint in_EDX;
  int *in_RSI;
  char *in_RDI;
  int in_R8D;
  code *in_R9;
  float fVar10;
  float fVar11;
  float p2Max;
  float p1Max;
  Rgba *p2;
  Rgba *p1;
  int x;
  int y_3;
  int y_2;
  int i;
  int y_1;
  int y;
  RgbaInputFile in;
  RgbaOutputFile out;
  Array2D<Imf_3_2::Rgba> pixels2;
  Array2D<Imf_3_2::Rgba> pixels1;
  int h;
  int w;
  undefined4 uVar12;
  undefined4 in_stack_fffffffffffffdd4;
  undefined4 in_stack_fffffffffffffddc;
  long in_stack_fffffffffffffe10;
  long in_stack_fffffffffffffe18;
  Array2D<Imf_3_2::Rgba> *in_stack_fffffffffffffe20;
  int local_e8;
  int local_e4;
  int local_dc;
  int local_d8;
  int local_d4;
  Rgba local_d0 [8];
  Vec2<float> local_90;
  Rgba local_88 [5];
  Array2D<Imf_3_2::Rgba> local_60;
  Array2D<Imf_3_2::Rgba> local_48;
  int local_30;
  int local_2c;
  code *local_28;
  int local_1c;
  int local_18;
  uint local_14;
  int *local_10;
  char *local_8;
  
  local_2c = (in_RSI[2] - *in_RSI) + 1;
  local_30 = (in_RSI[3] - in_RSI[1]) + 1;
  local_28 = in_R9;
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  poVar7 = (ostream *)std::ostream::operator<<(&std::cout,local_2c);
  poVar7 = std::operator<<(poVar7," by ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_30);
  poVar7 = std::operator<<(poVar7," pixels, channels ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_14);
  poVar7 = std::operator<<(poVar7,", write order ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_18);
  poVar7 = std::operator<<(poVar7,", read order ");
  pvVar8 = (void *)std::ostream::operator<<(poVar7,local_1c);
  std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
  (*local_28)(&local_48,local_2c,local_30);
  poVar7 = std::operator<<((ostream *)&std::cout,"writing ");
  std::ostream::operator<<(poVar7,std::flush<char,std::char_traits<char>>);
  pcVar3 = local_8;
  piVar2 = local_10;
  uVar1 = local_14;
  Imath_3_2::Vec2<float>::Vec2(&local_90,0.0,0.0);
  uVar5 = Imf_3_2::globalThreadCount();
  uVar12 = 4;
  Imf_3_2::RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)0x3f800000,local_88,pcVar3,piVar2,piVar2,uVar1,&local_90,local_18);
  Imf_3_2::RgbaOutputFile::setYCRounding((uint)local_88,9);
  pRVar9 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_48,(long)-local_10[1]);
  Imf_3_2::RgbaOutputFile::setFrameBuffer(local_88,(ulong)(pRVar9 + -*local_10),1);
  Imf_3_2::RgbaOutputFile::writePixels((int)local_88);
  Imf_3_2::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)local_88);
  poVar7 = std::operator<<((ostream *)&std::cout,"reading ");
  std::ostream::operator<<(poVar7,std::flush<char,std::char_traits<char>>);
  pcVar3 = local_8;
  iVar6 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_d0,pcVar3,iVar6);
  pRVar9 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_60,(long)-local_10[1]);
  Imf_3_2::RgbaInputFile::setFrameBuffer(local_d0,(ulong)(pRVar9 + -*local_10),1);
  switch(local_1c) {
  case 0:
    for (local_d4 = local_10[1]; local_d4 <= local_10[3]; local_d4 = local_d4 + 1) {
      Imf_3_2::RgbaInputFile::readPixels((int)local_d0);
    }
    break;
  case 1:
    for (local_d8 = local_10[3]; local_10[1] <= local_d8; local_d8 = local_d8 + -1) {
      Imf_3_2::RgbaInputFile::readPixels((int)local_d0);
    }
    break;
  case 2:
    if (local_30 % 5 == 0) {
      __assert_fail("h % 5 != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testYca.cpp"
                    ,0x88,
                    "void (anonymous namespace)::writeReadYca(const char *, const Box2i &, RgbaChannels, LineOrder, LineOrder, void (*)(Array2D<Rgba> &, int, int))"
                   );
    }
    for (local_dc = 0; local_dc < local_30; local_dc = local_dc + 1) {
      Imf_3_2::RgbaInputFile::readPixels((int)local_d0);
    }
    break;
  case 3:
  default:
    poVar7 = std::operator<<((ostream *)&std::cerr,"invalid line order ");
    pvVar8 = (void *)std::ostream::operator<<(poVar7,local_1c);
    std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
  }
  Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_d0);
  poVar7 = std::operator<<((ostream *)&std::cout,"comparing");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  local_e4 = 0;
  do {
    if (local_30 <= local_e4) {
      remove(local_8);
      Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D
                ((Array2D<Imf_3_2::Rgba> *)CONCAT44(in_stack_fffffffffffffdd4,uVar12));
      Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D
                ((Array2D<Imf_3_2::Rgba> *)CONCAT44(in_stack_fffffffffffffdd4,uVar12));
      return;
    }
    for (local_e8 = 0; local_e8 < local_2c; local_e8 = local_e8 + 1) {
      Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_48,(long)local_e4);
      Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_60,(long)local_e4);
      if ((local_14 & 0x20) == 0) {
        fVar10 = Imath_3_2::half::operator_cast_to_float
                           ((half *)CONCAT44(in_stack_fffffffffffffdd4,uVar12));
        fVar11 = Imath_3_2::half::operator_cast_to_float
                           ((half *)CONCAT44(in_stack_fffffffffffffdd4,uVar12));
        if ((fVar10 != fVar11) || (NAN(fVar10) || NAN(fVar11))) {
          __assert_fail("p1.g == p2.g",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testYca.cpp"
                        ,0xaa,
                        "void (anonymous namespace)::writeReadYca(const char *, const Box2i &, RgbaChannels, LineOrder, LineOrder, void (*)(Array2D<Rgba> &, int, int))"
                       );
        }
        fVar10 = Imath_3_2::half::operator_cast_to_float
                           ((half *)CONCAT44(in_stack_fffffffffffffdd4,uVar12));
        fVar11 = Imath_3_2::half::operator_cast_to_float
                           ((half *)CONCAT44(in_stack_fffffffffffffdd4,uVar12));
        if ((fVar10 != fVar11) || (NAN(fVar10) || NAN(fVar11))) {
          __assert_fail("p1.b == p2.b",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testYca.cpp"
                        ,0xab,
                        "void (anonymous namespace)::writeReadYca(const char *, const Box2i &, RgbaChannels, LineOrder, LineOrder, void (*)(Array2D<Rgba> &, int, int))"
                       );
        }
      }
      else {
        std::max<Imath_3_2::half>
                  ((half *)CONCAT44(in_stack_fffffffffffffddc,uVar5),
                   (half *)CONCAT44(in_stack_fffffffffffffdd4,uVar12));
        std::max<Imath_3_2::half>
                  ((half *)CONCAT44(in_stack_fffffffffffffddc,uVar5),
                   (half *)CONCAT44(in_stack_fffffffffffffdd4,uVar12));
        fVar10 = Imath_3_2::half::operator_cast_to_float
                           ((half *)CONCAT44(in_stack_fffffffffffffdd4,uVar12));
        std::max<Imath_3_2::half>
                  ((half *)CONCAT44(in_stack_fffffffffffffddc,uVar5),
                   (half *)CONCAT44(in_stack_fffffffffffffdd4,uVar12));
        std::max<Imath_3_2::half>
                  ((half *)CONCAT44(in_stack_fffffffffffffddc,uVar5),
                   (half *)CONCAT44(in_stack_fffffffffffffdd4,uVar12));
        fVar11 = Imath_3_2::half::operator_cast_to_float
                           ((half *)CONCAT44(in_stack_fffffffffffffdd4,uVar12));
        bVar4 = Imath_3_2::equalWithAbsError<float>(fVar10,fVar11,0.03);
        if (!bVar4) {
          __assert_fail("equalWithAbsError (p1Max, p2Max, 0.03f)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testYca.cpp"
                        ,0xa6,
                        "void (anonymous namespace)::writeReadYca(const char *, const Box2i &, RgbaChannels, LineOrder, LineOrder, void (*)(Array2D<Rgba> &, int, int))"
                       );
        }
      }
      if ((local_14 & 8) != 0) {
        fVar10 = Imath_3_2::half::operator_cast_to_float
                           ((half *)CONCAT44(in_stack_fffffffffffffdd4,uVar12));
        fVar11 = Imath_3_2::half::operator_cast_to_float
                           ((half *)CONCAT44(in_stack_fffffffffffffdd4,uVar12));
        if ((fVar10 != fVar11) || (NAN(fVar10) || NAN(fVar11))) {
          __assert_fail("p1.a == p2.a",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testYca.cpp"
                        ,0xae,
                        "void (anonymous namespace)::writeReadYca(const char *, const Box2i &, RgbaChannels, LineOrder, LineOrder, void (*)(Array2D<Rgba> &, int, int))"
                       );
        }
      }
    }
    local_e4 = local_e4 + 1;
  } while( true );
}

Assistant:

void
writeReadYca (
    const char   fileName[],
    const Box2i& dw,
    RgbaChannels channels,
    LineOrder    writeOrder,
    LineOrder    readOrder,
    void (*fillPixels) (Array2D<Rgba>& pixels, int w, int h))
{
    int           w = dw.max.x - dw.min.x + 1;
    int           h = dw.max.y - dw.min.y + 1;
    Array2D<Rgba> pixels1 (h, w);
    Array2D<Rgba> pixels2 (h, w);

    cout << w << " by " << h
         << " pixels, "
            "channels "
         << channels
         << ", "
            "write order "
         << writeOrder
         << ", "
            "read order "
         << readOrder << endl;

    fillPixels (pixels1, w, h);

    cout << "writing " << flush;

    {
        RgbaOutputFile out (
            fileName,
            dw,
            dw, // display window, data window
            channels,
            1,          // pixelAspectRatio
            V2f (0, 0), // screenWindowCenter
            1,          // screenWindowWidth
            writeOrder);

        out.setYCRounding (9, 9);
        out.setFrameBuffer (&pixels1[-dw.min.y][-dw.min.x], 1, w);
        out.writePixels (h);
    }

    cout << "reading " << flush;

    {
        RgbaInputFile in (fileName);

        in.setFrameBuffer (&pixels2[-dw.min.y][-dw.min.x], 1, w);

        switch (readOrder)
        {
            case INCREASING_Y:

                for (int y = dw.min.y; y <= dw.max.y; ++y)
                    in.readPixels (y);

                break;

            case DECREASING_Y:

                for (int y = dw.max.y; y >= dw.min.y; --y)
                    in.readPixels (y);

                break;

            case RANDOM_Y:

                assert (h % 5 != 0);

                for (int i = 0; i < h; ++i)
                {
                    int y = dw.min.y + (i * 5) % h;
                    in.readPixels (y);
                }

                break;
            case NUM_LINEORDERS:
            default:
                cerr << "invalid line order " << int (readOrder) << std::endl;
                break;
        }
    }

    cout << "comparing" << endl;

    for (int y = 0; y < h; ++y)
    {
        for (int x = 0; x < w; ++x)
        {
            const Rgba& p1 = pixels1[y][x];
            const Rgba& p2 = pixels2[y][x];

            if (channels & WRITE_C)
            {
                float p1Max = max (p1.r, max (p1.g, p1.b));
                float p2Max = max (p2.r, max (p2.g, p2.b));

                assert (equalWithAbsError (p1Max, p2Max, 0.03f));
            }
            else
            {
                assert (p1.g == p2.g);
                assert (p1.b == p2.b);
            }

            if (channels & WRITE_A) { assert (p1.a == p2.a); }
        }
    }

    remove (fileName);
}